

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5VocabInstanceNewTerm(Fts5VocabCursor *pCsr)

{
  int iVar1;
  Fts5IndexIter *pFVar2;
  uint in_EAX;
  int iVar3;
  ulong uVar4;
  int nData;
  u8 *pData;
  int rc;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  pFVar2 = pCsr->pIter;
  if (pFVar2->bEof == '\0') {
    uVar4 = (ulong)*(ushort *)(*(long *)&pFVar2[3].nData + 4);
    nData = (int)pFVar2[uVar4 * 5 + 8].iRowid + -1;
    pData = (u8 *)(*(long *)&pFVar2[uVar4 * 5 + 7].nData + 1);
    iVar1 = pCsr->nLeTerm;
    if (-1 < iVar1) {
      iVar3 = iVar1;
      if (nData < iVar1) {
        iVar3 = nData;
      }
      iVar3 = memcmp(pCsr->zLeTerm,pData,(long)iVar3);
      if ((iVar3 < 0) || (iVar1 < nData && iVar3 == 0)) {
        pCsr->bEof = 1;
      }
    }
    sqlite3Fts5BufferSet((int *)((long)&uStack_28 + 4),&pCsr->term,nData,pData);
  }
  else {
    pCsr->bEof = 1;
    uStack_28._4_4_ = 0;
  }
  return uStack_28._4_4_;
}

Assistant:

static int fts5VocabInstanceNewTerm(Fts5VocabCursor *pCsr){
  int rc = SQLITE_OK;
  
  if( sqlite3Fts5IterEof(pCsr->pIter) ){
    pCsr->bEof = 1;
  }else{
    const char *zTerm;
    int nTerm;
    zTerm = sqlite3Fts5IterTerm(pCsr->pIter, &nTerm);
    if( pCsr->nLeTerm>=0 ){
      int nCmp = MIN(nTerm, pCsr->nLeTerm);
      int bCmp = memcmp(pCsr->zLeTerm, zTerm, nCmp);
      if( bCmp<0 || (bCmp==0 && pCsr->nLeTerm<nTerm) ){
        pCsr->bEof = 1;
      }
    }

    sqlite3Fts5BufferSet(&rc, &pCsr->term, nTerm, (const u8*)zTerm);
  }
  return rc;
}